

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O2

optional<pbrt::SquareMatrix<2>_> *
pbrt::Inverse<2>(optional<pbrt::SquareMatrix<2>_> *__return_storage_ptr__,SquareMatrix<2> *m)

{
  float fVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  int i;
  uint uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  int j_1;
  Float (*paFVar10) [2];
  long lVar11;
  int k;
  ulong uVar12;
  ulong uVar13;
  int k_1;
  undefined1 auVar14 [16];
  undefined1 auVar15 [64];
  Float minv [2] [2];
  int ipiv [2];
  int indxr [2];
  int indxc [2];
  
  ipiv[0] = 0;
  ipiv[1] = 0;
  for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
    minv[lVar5] = m->m[lVar5];
  }
  auVar14._8_4_ = 0x7fffffff;
  auVar14._0_8_ = 0x7fffffff7fffffff;
  auVar14._12_4_ = 0x7fffffff;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 2) {
      for (uVar4 = 1; -1 < (int)uVar4; uVar4 = uVar4 - 1) {
        iVar6 = indxr[uVar4];
        iVar8 = indxc[uVar4];
        if (iVar6 != iVar8) {
          for (lVar5 = 0; lVar5 != 2; lVar5 = lVar5 + 1) {
            FVar2 = minv[lVar5][iVar6];
            minv[lVar5][iVar6] = minv[lVar5][iVar8];
            minv[lVar5][iVar8] = FVar2;
          }
        }
      }
      SquareMatrix<2>::SquareMatrix((SquareMatrix<2> *)__return_storage_ptr__,minv);
      __return_storage_ptr__->set = true;
      return __return_storage_ptr__;
    }
    auVar15 = ZEXT1664(ZEXT816(0) << 0x40);
    uVar13 = 0;
    uVar7 = 0;
    paFVar10 = minv;
    for (uVar9 = 0; uVar9 != 2; uVar9 = uVar9 + 1) {
      if (ipiv[uVar9] != 1) {
        for (uVar12 = 0; uVar12 != 2; uVar12 = uVar12 + 1) {
          if (ipiv[uVar12] == 0) {
            auVar3 = vandps_avx(ZEXT416(*(uint *)((long)paFVar10 + uVar12 * 4)),auVar14);
            if (auVar15._0_4_ <= auVar3._0_4_) {
              uVar13 = uVar9 & 0xffffffff;
              uVar7 = uVar12 & 0xffffffff;
              auVar15 = ZEXT1664(auVar3);
            }
          }
          else if (1 < ipiv[uVar12]) goto LAB_00482034;
        }
      }
      paFVar10 = (Float (*) [2])((long)paFVar10 + 8);
    }
    iVar6 = (int)uVar7;
    ipiv[iVar6] = ipiv[iVar6] + 1;
    iVar8 = (int)uVar13;
    if (iVar8 != iVar6) {
      for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
        FVar2 = minv[iVar8][lVar11];
        minv[iVar8][lVar11] = minv[iVar6][lVar11];
        minv[iVar6][lVar11] = FVar2;
      }
    }
    indxr[lVar5] = iVar8;
    indxc[lVar5] = iVar6;
    fVar1 = minv[iVar6][iVar6];
    if ((fVar1 == 0.0) && (!NAN(fVar1))) break;
    minv[iVar6][iVar6] = 1.0;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      minv[iVar6][lVar11] = (1.0 / fVar1) * minv[iVar6][lVar11];
    }
    paFVar10 = minv;
    for (uVar13 = 0; uVar13 != 2; uVar13 = uVar13 + 1) {
      if (uVar13 != uVar7) {
        FVar2 = minv[uVar13][iVar6];
        minv[uVar13][iVar6] = 0.0;
        for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
          auVar3 = vfnmadd213ss_fma(ZEXT416((uint)minv[iVar6][lVar11]),ZEXT416((uint)FVar2),
                                    ZEXT416(*(uint *)((long)paFVar10 + lVar11 * 4)));
          *(int *)((long)paFVar10 + lVar11 * 4) = auVar3._0_4_;
        }
      }
      paFVar10 = (Float (*) [2])((long)paFVar10 + 8);
    }
    lVar5 = lVar5 + 1;
  }
LAB_00482034:
  *(undefined4 *)&__return_storage_ptr__->set = 0;
  __return_storage_ptr__->optionalValue =
       (aligned_storage_t<sizeof(pbrt::SquareMatrix<2>),_alignof(pbrt::SquareMatrix<2>)>)
       (ZEXT416(0) << 0x40);
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<SquareMatrix<N>> Inverse(const SquareMatrix<N> &m) {
    int indxc[N], indxr[N];
    int ipiv[N] = {0};
    Float minv[N][N];
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < N; ++j)
            minv[i][j] = m[i][j];
    for (int i = 0; i < N; i++) {
        int irow = 0, icol = 0;
        Float big = 0.f;
        // Choose pivot
        for (int j = 0; j < N; j++) {
            if (ipiv[j] != 1) {
                for (int k = 0; k < N; k++) {
                    if (ipiv[k] == 0) {
                        if (std::abs(minv[j][k]) >= big) {
                            big = std::abs(minv[j][k]);
                            irow = j;
                            icol = k;
                        }
                    } else if (ipiv[k] > 1)
                        return {};  // singular
                }
            }
        }
        ++ipiv[icol];
        // Swap rows _irow_ and _icol_ for pivot
        if (irow != icol) {
            for (int k = 0; k < N; ++k)
                pstd::swap(minv[irow][k], minv[icol][k]);
        }
        indxr[i] = irow;
        indxc[i] = icol;
        if (minv[icol][icol] == 0.f)
            return {};  // singular

        // Set $m[icol][icol]$ to one by scaling row _icol_ appropriately
        Float pivinv = 1. / minv[icol][icol];
        minv[icol][icol] = 1.;
        for (int j = 0; j < N; j++)
            minv[icol][j] *= pivinv;

        // Subtract this row from others to zero out their columns
        for (int j = 0; j < N; j++) {
            if (j != icol) {
                Float save = minv[j][icol];
                minv[j][icol] = 0;
                for (int k = 0; k < N; k++)
                    minv[j][k] = FMA(-minv[icol][k], save, minv[j][k]);
            }
        }
    }
    // Swap columns to reflect permutation
    for (int j = N - 1; j >= 0; j--) {
        if (indxr[j] != indxc[j]) {
            for (int k = 0; k < N; k++)
                pstd::swap(minv[k][indxr[j]], minv[k][indxc[j]]);
        }
    }
    return SquareMatrix<N>(minv);
}